

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O1

forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_> __thiscall
TasGrid::readTensorDataList<TasGrid::IO::mode_ascii_type>
          (TasGrid *this,istream *is,size_t num_dimensions)

{
  _Node *p_Var1;
  _Fwd_list_node_base *in_RCX;
  _Fwd_list_node_base *__to;
  int iVar2;
  double v_1;
  int v;
  TensorData local_a0;
  
  *(undefined8 *)this = 0;
  ::std::istream::operator>>((istream *)is,(int *)&local_a0);
  if (0 < local_a0.weight._0_4_) {
    iVar2 = local_a0.weight._0_4_;
    do {
      ::std::istream::_M_extract<double>((double *)is);
      IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
                (&local_a0.tensor,(IO *)is,(istream *)num_dimensions,(unsigned_long)in_RCX);
      local_a0.points.num_dimensions = 0;
      local_a0.points.cache_num_indexes = 0;
      local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = 0;
      local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._8_8_ = 0;
      local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var1 = ::std::_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>::
               _M_create_node<TasGrid::TensorData>
                         ((_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>
                           *)this,&local_a0);
      in_RCX = *(_Fwd_list_node_base **)this;
      (p_Var1->super__Fwd_list_node_base)._M_next = in_RCX;
      *(_Node **)this = p_Var1;
      if (local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ =
             local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ =
             local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0.tensor.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.tensor.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.tensor.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.tensor.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return (_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>)
         (_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>)this;
}

Assistant:

std::forward_list<TensorData> readTensorDataList(std::istream &is, size_t num_dimensions){
    std::forward_list<TensorData> tensors;
    int num_entries = IO::readNumber<iomode, int>(is);

    for(int i=0; i<num_entries; i++){
        tensors.emplace_front(TensorData{
                              IO::readNumber<iomode, double>(is), // weight
                              IO::readVector<iomode, int>(is, num_dimensions), // tensor
                              MultiIndexSet(), // points, will be set later
                              std::vector<bool>() // loaded, will be set later
                              });
    }

    return tensors;
}